

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeMassMatrixAndGravityForce(ChElementBeamANCF_3243 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double xi;
  double eta;
  double zeta;
  undefined8 uVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  double dVar15;
  undefined1 auVar16 [16];
  ChMatrixNM<double,_NSF,_NSF>_conflict MassMatrixCompactSquare;
  VectorN Sxi_compact;
  type tmp;
  double local_4c0 [64];
  DenseStorage<double,_8,_8,_1,_0> local_2c0;
  double adStack_280 [8];
  double adStack_240 [8];
  double adStack_200 [8];
  double adStack_1c0 [8];
  double adStack_180 [8];
  double adStack_140 [8];
  double adStack_100 [8];
  double adStack_c0 [18];
  
  local_4c0[0x38] = 0.0;
  local_4c0[0x39] = 0.0;
  local_4c0[0x3a] = 0.0;
  local_4c0[0x3b] = 0.0;
  local_4c0[0x3c] = 0.0;
  local_4c0[0x3d] = 0.0;
  local_4c0[0x3e] = 0.0;
  local_4c0[0x3f] = 0.0;
  local_4c0[0x30] = 0.0;
  local_4c0[0x31] = 0.0;
  local_4c0[0x32] = 0.0;
  local_4c0[0x33] = 0.0;
  local_4c0[0x34] = 0.0;
  local_4c0[0x35] = 0.0;
  local_4c0[0x36] = 0.0;
  local_4c0[0x37] = 0.0;
  local_4c0[0x28] = 0.0;
  local_4c0[0x29] = 0.0;
  local_4c0[0x2a] = 0.0;
  local_4c0[0x2b] = 0.0;
  local_4c0[0x2c] = 0.0;
  local_4c0[0x2d] = 0.0;
  local_4c0[0x2e] = 0.0;
  local_4c0[0x2f] = 0.0;
  local_4c0[0x20] = 0.0;
  local_4c0[0x21] = 0.0;
  local_4c0[0x22] = 0.0;
  local_4c0[0x23] = 0.0;
  local_4c0[0x24] = 0.0;
  local_4c0[0x25] = 0.0;
  local_4c0[0x26] = 0.0;
  local_4c0[0x27] = 0.0;
  local_4c0[0x18] = 0.0;
  local_4c0[0x19] = 0.0;
  local_4c0[0x1a] = 0.0;
  local_4c0[0x1b] = 0.0;
  local_4c0[0x1c] = 0.0;
  local_4c0[0x1d] = 0.0;
  local_4c0[0x1e] = 0.0;
  local_4c0[0x1f] = 0.0;
  local_4c0[0x10] = 0.0;
  local_4c0[0x11] = 0.0;
  local_4c0[0x12] = 0.0;
  local_4c0[0x13] = 0.0;
  local_4c0[0x14] = 0.0;
  local_4c0[0x15] = 0.0;
  local_4c0[0x16] = 0.0;
  local_4c0[0x17] = 0.0;
  local_4c0[8] = 0.0;
  local_4c0[9] = 0.0;
  local_4c0[10] = 0.0;
  local_4c0[0xb] = 0.0;
  local_4c0[0xc] = 0.0;
  local_4c0[0xd] = 0.0;
  local_4c0[0xe] = 0.0;
  local_4c0[0xf] = 0.0;
  local_4c0[0] = 0.0;
  local_4c0[1] = 0.0;
  local_4c0[2] = 0.0;
  local_4c0[3] = 0.0;
  local_4c0[4] = 0.0;
  local_4c0[5] = 0.0;
  local_4c0[6] = 0.0;
  local_4c0[7] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  peVar6 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = peVar6->m_rho;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(DAT_00b92c78 + 0x80) != *(long *)(DAT_00b92c78 + 0x78)) {
    uVar9 = 0;
    do {
      if (*(long *)(DAT_00b92c78 + 0x20) != *(long *)(DAT_00b92c78 + 0x18)) {
        uVar10 = 0;
        do {
          lVar7 = *(long *)(DAT_00b92c78 + 0x18);
          if (*(long *)(DAT_00b92c78 + 0x20) != lVar7) {
            uVar12 = 0;
            do {
              dVar2 = *(double *)(*(long *)(static_tables_3243 + 0x78) + uVar9 * 8);
              dVar3 = *(double *)(*(long *)(static_tables_3243 + 0x18) + uVar10 * 8);
              dVar4 = *(double *)(*(long *)(static_tables_3243 + 0x18) + uVar12 * 8);
              xi = *(double *)(*(long *)(DAT_00b92c78 + 0x78) + uVar9 * 8);
              eta = *(double *)(lVar7 + uVar10 * 8);
              zeta = *(double *)(lVar7 + uVar12 * 8);
              dVar15 = Calc_det_J_0xi(this,xi,eta,zeta);
              Calc_Sxi_compact(this,(VectorN *)&local_2c0,xi,eta,zeta);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = dVar15 * dVar2 * dVar3 * dVar4 * dVar1;
              auVar13 = vbroadcastsd_avx512f(auVar16);
              auVar13 = vmulpd_avx512f(auVar13,(undefined1  [64])local_2c0.m_data.array);
              auVar14 = vaddpd_avx512f(auVar13,*(undefined1 (*) [64])
                                                (this->m_GravForceScale).
                                                super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
                                                .m_storage.m_data.array);
              *(undefined1 (*) [64])
               (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
               .m_storage.m_data.array = auVar14;
              lVar7 = 0;
              do {
                uVar5 = *(undefined8 *)((long)local_2c0.m_data.array + lVar7);
                auVar14._8_8_ = uVar5;
                auVar14._0_8_ = uVar5;
                auVar14._16_8_ = uVar5;
                auVar14._24_8_ = uVar5;
                auVar14._32_8_ = uVar5;
                auVar14._40_8_ = uVar5;
                auVar14._48_8_ = uVar5;
                auVar14._56_8_ = uVar5;
                auVar14 = vmulpd_avx512f(auVar13,auVar14);
                *(undefined1 (*) [64])(adStack_280 + lVar7) = auVar14;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x40);
              lVar7 = 0;
              do {
                dVar2 = *(double *)((long)adStack_240 + lVar7);
                local_4c0[lVar7] = *(double *)((long)adStack_280 + lVar7) + local_4c0[lVar7];
                local_4c0[lVar7 + 1] = dVar2 + local_4c0[lVar7 + 1];
                local_4c0[lVar7 + 2] = *(double *)((long)adStack_200 + lVar7) + local_4c0[lVar7 + 2]
                ;
                local_4c0[lVar7 + 3] = *(double *)((long)adStack_1c0 + lVar7) + local_4c0[lVar7 + 3]
                ;
                local_4c0[lVar7 + 4] = *(double *)((long)adStack_180 + lVar7) + local_4c0[lVar7 + 4]
                ;
                local_4c0[lVar7 + 5] = *(double *)((long)adStack_140 + lVar7) + local_4c0[lVar7 + 5]
                ;
                local_4c0[lVar7 + 6] = *(double *)((long)adStack_100 + lVar7) + local_4c0[lVar7 + 6]
                ;
                local_4c0[lVar7 + 7] = *(double *)((long)adStack_c0 + lVar7) + local_4c0[lVar7 + 7];
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x40);
              uVar12 = (ulong)((int)uVar12 + 1);
              lVar7 = *(long *)(DAT_00b92c78 + 0x18);
            } while (uVar12 < (ulong)(*(long *)(DAT_00b92c78 + 0x20) - lVar7 >> 3));
          }
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (uVar10 < (ulong)(*(long *)(DAT_00b92c78 + 0x20) - *(long *)(DAT_00b92c78 + 0x18) >>
                                 3));
      }
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (uVar9 < (ulong)(*(long *)(DAT_00b92c78 + 0x80) - *(long *)(DAT_00b92c78 + 0x78) >> 3));
  }
  lVar7 = 0;
  pdVar8 = local_4c0;
  uVar9 = 0;
  do {
    uVar10 = uVar9;
    if ((uint)uVar9 < 0x25) {
      uVar10 = 0x24;
    }
    lVar11 = 0;
    do {
      if (uVar10 - uVar9 == lVar11) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 36, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 36, 1>, Level = 1]"
                     );
      }
      (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.m_storage.
      m_data.array[uVar9 + lVar11] = pdVar8[lVar11];
      lVar11 = lVar11 + 1;
    } while ((int)lVar11 + (int)lVar7 != 8);
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 9;
    uVar9 = (ulong)((uint)uVar9 + (int)lVar11);
  } while (lVar7 != 8);
  return;
}

Assistant:

void ChElementBeamANCF_3243::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 10 in xi, 3 in eta, and 3 in zeta.
    // 4 GQ Points are needed in the xi direction and 2 GQ Points are needed in the eta and zeta directions for
    // exact integration of the element's mass matrix, even if the reference configuration is not straight. Since the
    // major pieces of the generalized force due to gravity can also be used to calculate the mass matrix, these
    // calculations are performed at the same time.  Only the matrix that scales the acceleration due to gravity is
    // calculated at this time so that any changes to the acceleration due to gravity in the system are correctly
    // accounted for in the generalized internal force calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = 5;        // 6 Point Gauss-Quadrature;
    unsigned int GQ_idx_eta_zeta = 1;  // 2 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    double rho = GetMaterial()->Get_rho();  // Density of the material for the element

    // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];
                double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta);  // determinant of the element Jacobian (volume ratio)

                VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

                m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}